

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O2

void err_msg<unsigned_char,int>(string *msg,uchar t,int u,bool expected)

{
  ostream *poVar1;
  string sStack_68;
  string local_48;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)msg);
  to_hex<unsigned_char>(&local_48,t);
  poVar1 = std::operator<<(poVar1,(string *)&local_48);
  poVar1 = std::operator<<(poVar1,", ");
  to_hex<int>(&sStack_68,u);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_68);
  poVar1 = std::operator<<(poVar1,", expected = ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void err_msg(const std::string& msg, T t, U u, bool expected)
{
	std::cerr << msg << to_hex(t) << ", " << to_hex(u) << ", expected = " << expected << std::endl;
}